

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EdgeTopology.hpp
# Opt level: O2

EdgeTopology *
eos::morphablemodel::load_edge_topology(EdgeTopology *__return_storage_ptr__,string *filename)

{
  runtime_error *this;
  NameValuePair<eos::morphablemodel::EdgeTopology_&> local_408;
  JSONInputArchive output_archive;
  ifstream file;
  byte abStack_208 [488];
  
  (__return_storage_ptr__->adjacent_vertices).
  super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->adjacent_vertices).
  super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->adjacent_faces).
  super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->adjacent_vertices).
  super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->adjacent_faces).
  super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->adjacent_faces).
  super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::ifstream::ifstream(&file,(string *)filename,_S_in);
  if ((abStack_208[*(long *)(_file + -0x18)] & 5) == 0) {
    cereal::JSONInputArchive::JSONInputArchive(&output_archive,(istream *)&file);
    local_408.name = "edge_topology";
    local_408.value = __return_storage_ptr__;
    cereal::InputArchive<cereal::JSONInputArchive,0u>::operator()
              ((InputArchive<cereal::JSONInputArchive,0u> *)&output_archive,&local_408);
    cereal::JSONInputArchive::~JSONInputArchive(&output_archive);
    std::ifstream::~ifstream(&file);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &output_archive,"Error opening file for reading: ",filename);
  std::runtime_error::runtime_error(this,(string *)&output_archive);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline EdgeTopology load_edge_topology(std::string filename)
{
    EdgeTopology edge_topology;
    std::ifstream file(filename);
    if (!file)
    {
        throw std::runtime_error("Error opening file for reading: " + filename);
    }
    cereal::JSONInputArchive output_archive(file);
    output_archive(cereal::make_nvp("edge_topology", edge_topology));

    return edge_topology;
}